

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O1

void Ring_off_or_gone(obj *obj,boolean gone)

{
  schar *psVar1;
  schar sVar2;
  schar sVar3;
  uint uVar4;
  char *pcVar5;
  int oindx;
  uint uVar6;
  
  if (obj == (obj *)0x0) {
    return;
  }
  uVar6 = obj->owornmask & 0x60000;
  uVar4 = u.uprops[objects[obj->otyp].oc_oprop].extrinsic;
  Oprops_off(obj,uVar6);
  takeoff_mask = takeoff_mask & (int)~uVar6;
  if ((u.uprops[objects[obj->otyp].oc_oprop].extrinsic & uVar6) == 0) {
    warning("Strange... I didn\'t know you had that ring.");
  }
  if (gone == '\0') {
    setworn((obj *)0x0,(long)obj->owornmask);
  }
  else {
    setnotworn(obj);
  }
  switch(obj->otyp) {
  case 0x9d:
    uVar4 = 5;
    break;
  case 0x9e:
    uVar4 = 0;
    break;
  case 0x9f:
    uVar4 = 4;
    break;
  case 0xa0:
    uVar4 = 1;
    break;
  case 0xa1:
    uVar4 = 2;
    break;
  case 0xa2:
    uVar4 = 3;
    break;
  case 0xa3:
    u.uhitinc = u.uhitinc - obj->spe;
    return;
  case 0xa4:
    u.udaminc = u.udaminc - obj->spe;
    return;
  case 0xa5:
    if (obj->spe != '\0') {
      iflags.botl = '\x01';
      discover_object(0xa5,'\x01','\x01');
      obj->field_0x4a = obj->field_0x4a | 0x10;
      update_inventory();
    }
  case 0xbb:
    restartcham();
    return;
  default:
    goto switchD_00184ebe_caseD_a6;
  case 0xa8:
    uVar6 = uVar4 & 0xfff9ffff;
    if ((~uVar4 & 0x60000) == 0) {
      uVar6 = uVar4;
    }
    if (uVar6 != 0) {
      return;
    }
    if (u.uprops[0x13].intrinsic != 0) {
      return;
    }
    if (u.uprops[0x13].blocked != 0) {
      return;
    }
    discover_object(0xa8,'\x01','\x01');
    pline("You sure are noisy.");
    return;
  case 0xaa:
    float_down(0,0);
    if (u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) {
      return;
    }
    if ((youmonst.data)->mlet == '\x05') {
      return;
    }
    oindx = 0xaa;
    goto LAB_0018528d;
  case 0xae:
    see_monsters();
    return;
  case 0xb9:
    if ((bool)(~((youmonst.data != mons + 0x7b && youmonst.data != mons + 0x9e) &&
                 (u.uprops[0xd].extrinsic == 0 && u.uprops[0xd].intrinsic == 0) ||
                u.uprops[0xd].blocked != 0) & 1U | u.uprops[0xd].blocked != 0)) {
      return;
    }
    if ((u.uprops[0x1e].intrinsic != 0) ||
       (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
        (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
      if (ublindf == (obj *)0x0) {
        return;
      }
      if (ublindf->oartifact != '\x1d') {
        return;
      }
    }
    newsym((int)u.ux,(int)u.uy);
    if (u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0) {
      pcVar5 = " completely";
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        pcVar5 = "..";
      }
    }
    else {
      pcVar5 = " completely";
    }
    pline("Your body seems to unfade%s.",pcVar5);
    oindx = 0xb9;
    goto LAB_0018528d;
  case 0xba:
    if ((u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0) &&
       (((youmonst.data)->mflags1 & 0x1000000) == 0)) {
      set_mimic_blocking();
      see_monsters();
    }
    if ((youmonst.data != mons + 0x7b && youmonst.data != mons + 0x9e) &&
        (u.uprops[0xd].extrinsic == 0 && u.uprops[0xd].intrinsic == 0)) {
      return;
    }
    if (u.uprops[0xd].blocked != 0) {
      return;
    }
    if (u.uprops[0xc].intrinsic != 0) {
      return;
    }
    if (u.uprops[0xc].extrinsic != 0) {
      return;
    }
    uVar4 = (youmonst.data)->mflags1;
    if ((uVar4 >> 0x18 & 1) != 0) {
      return;
    }
    if (u.uprops[0x1e].intrinsic == 0) {
      if (ublindf == (obj *)0x0) {
        if ((uVar4 >> 0xc & 1) != 0) goto LAB_001850f0;
      }
      else if (((uVar4 >> 0xc & 1) != 0) || (ublindf->otyp != 0xed)) goto LAB_001850f0;
    }
    else {
LAB_001850f0:
      if (ublindf == (obj *)0x0) {
        return;
      }
      if (ublindf->oartifact != '\x1d') {
        return;
      }
    }
    newsym((int)u.ux,(int)u.uy);
    pline("Suddenly you cannot see yourself.");
    oindx = 0xba;
LAB_0018528d:
    discover_object(oindx,'\x01','\x01');
    return;
  }
  sVar2 = acurr(uVar4);
  psVar1 = u.abon.a + uVar4;
  *psVar1 = *psVar1 - obj->spe;
  sVar3 = acurr(uVar4);
  if (sVar3 != sVar2) {
    iflags.botl = '\x01';
    discover_object((int)obj->otyp,'\x01','\x01');
    obj->field_0x4a = obj->field_0x4a | 0x10;
    update_inventory();
    return;
  }
switchD_00184ebe_caseD_a6:
  return;
}

Assistant:

static void Ring_off_or_gone(struct obj *obj, boolean gone)
{
    long mask;
    long oldprop;
    int old_attrib, which;

    if (!obj) return;

    mask = (obj->owornmask & W_RING);
    oldprop = u.uprops[objects[obj->otyp].oc_oprop].extrinsic;

    Oprops_off(obj, mask);

    takeoff_mask &= ~mask;
    if (!(u.uprops[objects[obj->otyp].oc_oprop].extrinsic & mask))
	warning("Strange... I didn't know you had that ring.");
    if (gone) setnotworn(obj);
    else setworn(NULL, obj->owornmask);

    /* only mask out W_RING when we don't have both
       left and right rings of the same type */
    if ((oldprop & W_RING) != W_RING) oldprop &= ~W_RING;

    switch(obj->otyp) {
	case RIN_TELEPORTATION:
	case RIN_REGENERATION:
	case RIN_SEARCHING:
	case RIN_HUNGER:
	case RIN_AGGRAVATE_MONSTER:
	case RIN_POISON_RESISTANCE:
	case RIN_FIRE_RESISTANCE:
	case RIN_COLD_RESISTANCE:
	case RIN_SHOCK_RESISTANCE:
	case RIN_CONFLICT:
	case RIN_TELEPORT_CONTROL:
	case RIN_POLYMORPH:
	case RIN_POLYMORPH_CONTROL:
	case RIN_FREE_ACTION:                
	case RIN_SLOW_DIGESTION:
	case RIN_SUSTAIN_ABILITY:
	case MEAT_RING:
		break;
	case RIN_STEALTH:
		if (!oldprop && !HStealth && !BStealth) {
		    makeknown(RIN_STEALTH);
		    pline("You sure are noisy.");
		}
		break;
	case RIN_WARNING:
		see_monsters();
		break;
	case RIN_SEE_INVISIBLE:
		/* Make invisible monsters go away */
		if (!See_invisible) {
		    set_mimic_blocking(); /* do special mimic handling */
		    see_monsters();
#ifdef INVISIBLE_OBJECTS                
		    see_objects();
#endif
		}

		if (Invisible && !Blind) {
		    newsym(u.ux,u.uy);
		    pline("Suddenly you cannot see yourself.");
		    makeknown(RIN_SEE_INVISIBLE);
		}
		break;
	case RIN_INVISIBILITY:
		if (!Invis && !BInvis && !Blind) {
		    newsym(u.ux,u.uy);
		    pline("Your body seems to unfade%s.",
			 See_invisible ? " completely" : "..");
		    makeknown(RIN_INVISIBILITY);
		}
		break;
	case RIN_LEVITATION:
		float_down(0L, 0L);
		if (!Levitation) makeknown(RIN_LEVITATION);
		break;
	case RIN_GAIN_STRENGTH:
		which = A_STR;
		goto adjust_attrib;
	case RIN_GAIN_CONSTITUTION:
		which = A_CON;
		goto adjust_attrib;
	case RIN_GAIN_INTELLIGENCE:
		which = A_INT;
		goto adjust_attrib;
	case RIN_GAIN_WISDOM:
		which = A_WIS;
		goto adjust_attrib;
	case RIN_GAIN_DEXTERITY:
		which = A_DEX;
		goto adjust_attrib;
	case RIN_ADORNMENT:
		which = A_CHA;
 adjust_attrib:
		old_attrib = ACURR(which);
		ABON(which) -= obj->spe;
		if (ACURR(which) != old_attrib) {
		    iflags.botl = 1;
		    makeknown(obj->otyp);
		    obj->known = 1;
		    update_inventory();
		}
		break;
	case RIN_INCREASE_ACCURACY:	/* KMH */
		u.uhitinc -= obj->spe;
		break;
	case RIN_INCREASE_DAMAGE:
		u.udaminc -= obj->spe;
		break;
	case RIN_PROTECTION:
		/* might have forgotten it due to amnesia */
		if (obj->spe) {
		    iflags.botl = 1;
		    makeknown(RIN_PROTECTION);
		    obj->known = 1;
		    update_inventory();
		}
	case RIN_PROTECTION_FROM_SHAPE_CHANGERS:
		/* If you're no longer protected, let the chameleons
		 * change shape again -dgk
		 */
		restartcham();
		break;
    }
}